

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

nng_err nng_http_server_hold(nng_http_server **srvp,nng_url *url)

{
  nng_err nVar1;
  nng_url *url_local;
  nng_http_server **srvp_local;
  
  nVar1 = nni_http_server_init(srvp,url);
  return nVar1;
}

Assistant:

nng_err
nng_http_server_hold(nng_http_server **srvp, const nng_url *url)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_server_init(srvp, url));
#else
	NNI_ARG_UNUSED(srvp);
	NNI_ARG_UNUSED(url);
	return (NNG_ENOTSUP);
#endif
}